

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

Scalar __thiscall
Eigen::
CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Dense>
::coeff(CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::Dense>
        *this,Index rowId,Index colId)

{
  return *(double *)(colId * *(long *)(this + 0x48) * 8 + *(long *)(this + 0x30) + rowId * 8) *
         *(double *)(this + 0x50) +
         *(double *)(*(long *)(this + 0x20) * colId * 8 + *(long *)(this + 8) + rowId * 8) *
         *(double *)(this + 0x28);
}

Assistant:

EIGEN_STRONG_INLINE const Scalar coeff(Index rowId, Index colId) const
    {
      return derived().functor()(derived().lhs().coeff(rowId, colId),
                                 derived().rhs().coeff(rowId, colId));
    }